

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_align_search.c
# Opt level: O0

ps_seg_t * state_align_search_seg_iter(ps_search_t *search)

{
  dict2pid_t *pdVar1;
  ps_alignment_iter_t *itor;
  state_align_seg_t *seg;
  state_align_search_t *sas;
  ps_search_t *search_local;
  
  if (search[1].type == (char *)0x0) {
    search_local = (ps_search_t *)0x0;
  }
  else {
    pdVar1 = (dict2pid_t *)ps_alignment_words((ps_alignment_t *)search[1].type);
    if (pdVar1 == (dict2pid_t *)0x0) {
      search_local = (ps_search_t *)0x0;
    }
    else {
      search_local = (ps_search_t *)
                     __ckd_calloc__(1,0x40,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/state_align_search.c"
                                    ,0x167);
      search_local->vt = (ps_searchfuncs_t *)&state_align_segfuncs;
      search_local->type = (char *)search;
      search_local->d2p = pdVar1;
      state_align_search_fill_iter((ps_seg_t *)search_local);
    }
  }
  return (ps_seg_t *)search_local;
}

Assistant:

static ps_seg_t *
state_align_search_seg_iter(ps_search_t * search)
{
    state_align_search_t *sas = (state_align_search_t *) search;
    state_align_seg_t *seg;
    ps_alignment_iter_t *itor;

    if (sas->al == NULL)
        return NULL;
    /* Even though the alignment has a bunch of levels, for the
       purposes of the decoder API we will just iterate over words,
       which is the most likely/useful use case.  We will also expose
       the rest of the alignment API separately. */

    itor = ps_alignment_words(sas->al);
    if (itor == NULL)
        return NULL;
    seg = ckd_calloc(1, sizeof(state_align_seg_t));
    seg->base.vt = &state_align_segfuncs;
    seg->base.search = search;
    seg->itor = itor;
    state_align_search_fill_iter((ps_seg_t *)seg);

    return (ps_seg_t *)seg;
}